

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O2

int __thiscall RenX_Ladder_WebPlugin::init(RenX_Ladder_WebPlugin *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *this_00;
  string *this_01;
  int iVar1;
  uint uVar2;
  unsigned_long uVar3;
  FILE *__stream;
  string_view in_key;
  string_view in_key_00;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  undefined1 auVar5 [16];
  allocator<char> local_89;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  string *local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->field_0x38;
  local_88 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get(this_00,0xe,"HeaderFilename",0x1b,"RenX.Ladder.Web.Header.html");
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,&local_88,&local_89);
  local_78 = &this->web_header_filename;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_78,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar4 = (basic_string_view<char,_std::char_traits<char>_>)
          Jupiter::Config::get(this_00,0xe,"FooterFilename",0x1b,"RenX.Ladder.Web.Footer.html");
  local_88 = bVar4;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,&local_88,&local_89);
  local_70 = &this->web_footer_filename;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar4 = (basic_string_view<char,_std::char_traits<char>_>)
          Jupiter::Config::get(this_00,0xf,"ProfileFilename",0x1c,"RenX.Ladder.Web.Profile.html");
  local_88 = bVar4;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,&local_88,&local_89);
  local_68 = &this->web_profile_filename;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_68,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar4 = (basic_string_view<char,_std::char_traits<char>_>)
          Jupiter::Config::get
                    (this_00,0x19,"LadderTableHeaderFilename",0x28,
                     "RenX.Ladder.Web.Ladder.Table.Header.html");
  local_88 = bVar4;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,&local_88,&local_89);
  local_60 = &this->web_ladder_table_header_filename;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_60,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar4 = (basic_string_view<char,_std::char_traits<char>_>)
          Jupiter::Config::get
                    (this_00,0x19,"LadderTableFooterFilename",0x28,
                     "RenX.Ladder.Web.Ladder.Table.Footer.html");
  local_88 = bVar4;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,&local_88,&local_89);
  local_58 = &this->web_ladder_table_footer_filename;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_58,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  in_key._M_str = "EntriesPerPage";
  in_key._M_len = 0xe;
  uVar3 = Jupiter::Config::get<unsigned_long>((Config *)this_00,in_key,0x32);
  this->entries_per_page = uVar3;
  in_key_00._M_str = "MinSearchNameLength";
  in_key_00._M_len = 0x13;
  uVar3 = Jupiter::Config::get<unsigned_long>((Config *)this_00,in_key_00,3);
  this->min_search_name_length = uVar3;
  local_50._0_16_ =
       Jupiter::Config::get
                 (this_00,0xd,"EntryTableRow",0x1b6,
                  "<tr><td class=\"data-col-a\">{RANK}</td><td class=\"data-col-b\"><a href=\"profile?id={STEAM}&database={OBJECT}\">{NAME}</a></td><td class=\"data-col-a\">{SCORE}</td><td class=\"data-col-b\">{SPM}</td><td class=\"data-col-a\">{GAMES}</td><td class=\"data-col-b\">{WINS}</td><td class=\"data-col-a\">{LOSSES}</td><td class=\"data-col-b\">{WLR}</td><td class=\"data-col-a\">{KILLS}</td><td class=\"data-col-b\">{DEATHS}</td><td class=\"data-col-a\">{KDR}</td></tr>"
                 );
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->entry_table_row,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_50);
  auVar5 = Jupiter::Config::get
                     (this_00,0x14,"EntryProfilePrevious",0xde,
                      "<form class=\"profile-previous\"><input type=\"hidden\" name=\"database\" value=\"{OBJECT}\"/><input type=\"hidden\" name=\"id\" value=\"{WEAPON}\"/><input class=\"profile-previous-submit\" type=\"submit\" value=\"&#x21A9 Previous\" /></form>"
                     );
  local_50._0_16_ = auVar5;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->entry_profile_previous,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_50);
  auVar5 = Jupiter::Config::get
                     (this_00,0x10,"EntryProfileNext",0xd2,
                      "<form class=\"profile-next\"><input type=\"hidden\" name=\"database\" value=\"{OBJECT}\"/><input type=\"hidden\" name=\"id\" value=\"{VSTEAM}\"/><input class=\"profile-next-submit\" type=\"submit\" value=\"Next &#x21AA\" /></form>"
                     );
  local_50._0_16_ = auVar5;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->entry_profile_next,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_50);
  RenX::sanitizeTags((string *)&this->entry_table_row);
  RenX::sanitizeTags((string *)&this->entry_profile_previous);
  RenX::sanitizeTags((string *)&this->entry_profile_next);
  (this->header)._M_string_length = 0;
  *(this->header)._M_dataplus._M_p = '\0';
  (this->footer)._M_string_length = 0;
  *(this->footer)._M_dataplus._M_p = '\0';
  this_01 = &this->entry_profile;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (this_01,0,0xffffffffffffffff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (&this->ladder_table_header,0,0xffffffffffffffff);
  __stream = (FILE *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::erase(&this->ladder_table_footer,0,0xffffffffffffffff);
  if ((this->web_header_filename)._M_string_length != 0) {
    __stream = fopen((local_78->_M_dataplus)._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      while( true ) {
        iVar1 = fgetc(__stream);
        if (iVar1 == -1) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&this->header,(char)iVar1);
      }
      uVar2 = fclose(__stream);
      __stream = (FILE *)(ulong)uVar2;
    }
  }
  if ((this->web_footer_filename)._M_string_length != 0) {
    __stream = fopen((local_70->_M_dataplus)._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      while( true ) {
        iVar1 = fgetc(__stream);
        if (iVar1 == -1) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&this->footer,(char)iVar1);
      }
      uVar2 = fclose(__stream);
      __stream = (FILE *)(ulong)uVar2;
    }
  }
  if ((this->web_profile_filename)._M_string_length != 0) {
    __stream = fopen((local_68->_M_dataplus)._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      while( true ) {
        iVar1 = fgetc(__stream);
        if (iVar1 == -1) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_01,(char)iVar1);
      }
      RenX::sanitizeTags((string *)this_01);
      uVar2 = fclose(__stream);
      __stream = (FILE *)(ulong)uVar2;
    }
  }
  if ((this->web_ladder_table_header_filename)._M_string_length != 0) {
    __stream = fopen((local_60->_M_dataplus)._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      while( true ) {
        iVar1 = fgetc(__stream);
        if (iVar1 == -1) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&this->ladder_table_header,(char)iVar1);
      }
      uVar2 = fclose(__stream);
      __stream = (FILE *)(ulong)uVar2;
    }
  }
  if ((this->web_ladder_table_footer_filename)._M_string_length != 0) {
    __stream = fopen((local_58->_M_dataplus)._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      while( true ) {
        iVar1 = fgetc(__stream);
        if (iVar1 == -1) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&this->ladder_table_footer,(char)iVar1);
      }
      uVar2 = fclose(__stream);
      __stream = (FILE *)(ulong)uVar2;
    }
  }
  return (int)__stream;
}

Assistant:

void RenX_Ladder_WebPlugin::init() {
	FILE *file;
	int chr;

	RenX_Ladder_WebPlugin::web_header_filename = static_cast<std::string>(this->config.get("HeaderFilename"sv, "RenX.Ladder.Web.Header.html"sv));
	RenX_Ladder_WebPlugin::web_footer_filename = static_cast<std::string>(this->config.get("FooterFilename"sv, "RenX.Ladder.Web.Footer.html"sv));
	RenX_Ladder_WebPlugin::web_profile_filename = static_cast<std::string>(this->config.get("ProfileFilename"sv, "RenX.Ladder.Web.Profile.html"sv));
	RenX_Ladder_WebPlugin::web_ladder_table_header_filename = static_cast<std::string>(this->config.get("LadderTableHeaderFilename"sv, "RenX.Ladder.Web.Ladder.Table.Header.html"sv));
	RenX_Ladder_WebPlugin::web_ladder_table_footer_filename = static_cast<std::string>(this->config.get("LadderTableFooterFilename"sv, "RenX.Ladder.Web.Ladder.Table.Footer.html"sv));
	RenX_Ladder_WebPlugin::entries_per_page = this->config.get<size_t>("EntriesPerPage"sv, 50);
	RenX_Ladder_WebPlugin::min_search_name_length = this->config.get<size_t>("MinSearchNameLength"sv, 3);

	RenX_Ladder_WebPlugin::entry_table_row = this->config.get("EntryTableRow"sv, R"html(<tr><td class="data-col-a">{RANK}</td><td class="data-col-b"><a href="profile?id={STEAM}&database={OBJECT}">{NAME}</a></td><td class="data-col-a">{SCORE}</td><td class="data-col-b">{SPM}</td><td class="data-col-a">{GAMES}</td><td class="data-col-b">{WINS}</td><td class="data-col-a">{LOSSES}</td><td class="data-col-b">{WLR}</td><td class="data-col-a">{KILLS}</td><td class="data-col-b">{DEATHS}</td><td class="data-col-a">{KDR}</td></tr>)html"sv);
	RenX_Ladder_WebPlugin::entry_profile_previous = this->config.get("EntryProfilePrevious"sv, R"html(<form class="profile-previous"><input type="hidden" name="database" value="{OBJECT}"/><input type="hidden" name="id" value="{WEAPON}"/><input class="profile-previous-submit" type="submit" value="&#x21A9 Previous" /></form>)html"sv);
	RenX_Ladder_WebPlugin::entry_profile_next = this->config.get("EntryProfileNext"sv, R"html(<form class="profile-next"><input type="hidden" name="database" value="{OBJECT}"/><input type="hidden" name="id" value="{VSTEAM}"/><input class="profile-next-submit" type="submit" value="Next &#x21AA" /></form>)html"sv);

	RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_table_row);
	RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_profile_previous);
	RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_profile_next);

	RenX_Ladder_WebPlugin::header.clear();
	RenX_Ladder_WebPlugin::footer.clear();
	RenX_Ladder_WebPlugin::entry_profile.erase();
	RenX_Ladder_WebPlugin::ladder_table_header.erase();
	RenX_Ladder_WebPlugin::ladder_table_footer.erase();

	/** Load header */
	if (!RenX_Ladder_WebPlugin::web_header_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_header_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::header += chr;
			fclose(file);
		}
	}

	/** Load footer */
	if (!RenX_Ladder_WebPlugin::web_footer_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_footer_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::footer += chr;
			fclose(file);
		}
	}

	/** Load profile */
	if (!RenX_Ladder_WebPlugin::web_profile_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_profile_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::entry_profile += chr;
			RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_profile);
			fclose(file);
		}
	}

	/** Load table header */
	if (!RenX_Ladder_WebPlugin::web_ladder_table_header_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_ladder_table_header_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::ladder_table_header += chr;
			fclose(file);
		}
	}

	/** Load table footer */
	if (!RenX_Ladder_WebPlugin::web_ladder_table_footer_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_ladder_table_footer_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::ladder_table_footer += chr;
			fclose(file);
		}
	}
}